

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSaxFWLError.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::SaxFWLError::SaxFWLError
          (SaxFWLError *this,ErrorType errorType,String *errorMessage,Severity severity)

{
  (this->super_IError)._vptr_IError = (_func_int **)&PTR__SaxFWLError_00954400;
  this->mErrorType = errorType;
  this->mSeverity = severity;
  std::__cxx11::string::string((string *)&this->mErrorMessage,(string *)errorMessage);
  this->mLineNumber = 0;
  this->mColumnNumber = 0;
  return;
}

Assistant:

SaxFWLError::SaxFWLError( ErrorType errorType, String errorMessage, IError::Severity severity )
		: mErrorType(errorType)
		, mSeverity(severity)
		, mErrorMessage(errorMessage)
		, mLineNumber(0)
		, mColumnNumber(0)
	{
	}